

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void __thiscall
pdqsort_detail::
pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0,false>
          (pdqsort_detail *this,
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          begin,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                end,anon_class_16_2_a9e7a8bd comp,int bad_allowed,bool leftmost)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  double dVar3;
  int iVar4;
  pointer ppVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  HighsInt HVar15;
  pointer ppVar16;
  pointer ppVar17;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  c;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  c_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsTableauSeparator_cpp:106:11)>
  __comp;
  bool bVar18;
  bool bVar19;
  ulong uVar20;
  long lVar21;
  double *pdVar22;
  FractionalInteger *pFVar23;
  ulong uVar24;
  FractionalInteger *pFVar25;
  ulong uVar26;
  ulong uVar27;
  pointer ppVar28;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var29;
  long lVar30;
  FractionalInteger *pFVar31;
  long lVar32;
  HighsTableauSeparator *pHVar33;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var34;
  long lVar35;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pvVar36;
  FractionalInteger *pFVar37;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pvVar38;
  double score1;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  anon_class_16_2_a9e7a8bd comp_00;
  anon_class_16_2_a9e7a8bd comp_01;
  anon_class_16_2_a9e7a8bd comp_02;
  anon_class_16_2_a9e7a8bd comp_03;
  anon_class_16_2_a9e7a8bd comp_04;
  anon_class_16_2_a9e7a8bd comp_05;
  anon_class_16_2_a9e7a8bd comp_06;
  anon_class_16_2_a9e7a8bd comp_07;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsTableauSeparator_cpp:106:11)>
  __comp_00;
  _DistanceType __len;
  undefined1 leftmost_00;
  undefined7 uStack_1c7;
  FractionalInteger local_198;
  pointer local_158;
  pointer ppStack_150;
  FractionalInteger *local_148;
  pointer ppStack_140;
  uint local_12c;
  pointer local_128;
  pointer ppStack_120;
  pointer local_118;
  pointer ppStack_110;
  int local_fc;
  pointer local_f8;
  pointer ppStack_f0;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_e0;
  pointer local_d8;
  pointer ppStack_d0;
  pointer local_c8;
  pointer ppStack_c0;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_b0;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_a8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_a0;
  FractionalInteger *local_98;
  FractionalInteger *local_90;
  double local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined8 uStack_74;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_60;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_58;
  pointer local_50;
  pointer local_48;
  pointer ppStack_40;
  
  comp_00.edgeWt = (HighsTableauSeparator *)comp.edgeWt;
  local_fc = (int)comp.this;
  local_e0._M_current = begin._M_current + -1;
  local_a0._M_current = begin._M_current + -2;
  local_a8._M_current = begin._M_current + -3;
  local_b0 = &begin._M_current[-1].row_ep;
  local_58 = &begin._M_current[-2].row_ep;
  local_60 = &begin._M_current[-3].row_ep;
  leftmost_00 = SUB81(end._M_current,0);
  uStack_1c7 = (undefined7)((ulong)end._M_current >> 8);
  local_12c = bad_allowed;
  do {
    local_128 = (pointer)((long)begin._M_current - (long)this);
    if ((long)local_128 < 0x540) {
      pFVar23 = (FractionalInteger *)((long)this + 0x38);
      if ((local_12c & 1) == 0) {
        if (pFVar23 == begin._M_current || (FractionalInteger *)this == begin._M_current)
        goto LAB_002ed3c9;
        pvVar36 = &((FractionalInteger *)this)->row_ep;
        local_148 = (FractionalInteger *)this;
        do {
          local_128 = (pointer)local_148[1].fractionality;
          local_118 = (pointer)CONCAT44(local_118._4_4_,local_148[1].basisIndex);
          lVar35 = (long)local_148[1].basisIndex;
          dVar45 = (1.0 - (double)local_128) * (double)local_128;
          uVar2 = *(undefined8 *)((long)(end._M_current)->fractionality + lVar35 * 8);
          auVar43._8_8_ = dVar45;
          auVar43._0_8_ = (1.0 - local_148->fractionality) * local_148->fractionality;
          auVar9._8_4_ = (int)uVar2;
          auVar9._0_8_ = *(undefined8 *)
                          ((long)(end._M_current)->fractionality + (long)local_148->basisIndex * 8);
          auVar9._12_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar40 = divpd(auVar43,auVar9);
          if ((auVar40._0_8_ < auVar40._8_8_) ||
             ((auVar40._0_8_ <= auVar40._8_8_ &&
              (uVar20 = (long)local_148->basisIndex + (comp_00.edgeWt)->numTries,
              uVar26 = uVar20 >> 0x20, uVar20 = uVar20 & 0xffffffff,
              uVar24 = (comp_00.edgeWt)->numTries + lVar35, uVar27 = uVar24 & 0xffffffff,
              uVar24 = uVar24 >> 0x20,
              ((uVar20 + 0x42d8680e260ae5b) * (uVar26 + 0x8a183895eeac1536) ^
              (uVar26 + 0x80c8963be3e4c2f3) * (uVar20 + 0xc8497d2a400d9551) >> 0x20) <
              ((uVar27 + 0x42d8680e260ae5b) * (uVar24 + 0x8a183895eeac1536) ^
              (uVar24 + 0x80c8963be3e4c2f3) * (uVar27 + 0xc8497d2a400d9551) >> 0x20))))) {
            ppStack_120 = (pointer)0x0;
            local_198.fractionality = local_148[1].row_ep_norm2;
            local_198.row_ep_norm2._0_4_ = SUB84(local_148[1].score,0);
            local_198.row_ep_norm2._4_4_ = (undefined4)((ulong)local_148[1].score >> 0x20);
            local_158 = local_148[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppStack_150 = local_148[1].row_ep.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            local_f8 = local_148[1].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_148[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_148[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_148[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar38 = pvVar36;
            local_148 = pFVar23;
            while( true ) {
              uVar2 = *(undefined8 *)((long)(pvVar38 + -2) + 0x10);
              dVar3 = *(double *)(pvVar38 + -1);
              uVar12 = *(undefined4 *)((long)(pvVar38 + -1) + 8);
              uVar13 = *(undefined4 *)((long)(pvVar38 + -1) + 0xc);
              HVar15 = *(HighsInt *)((long)(pvVar38 + -1) + 0x10);
              *(undefined4 *)((long)(pvVar38 + 1) + 0xc) = *(undefined4 *)((long)(pvVar38 + -1) + 4)
              ;
              *(undefined4 *)((long)(pvVar38 + 1) + 0x10) = uVar12;
              *(undefined4 *)((long)(pvVar38 + 1) + 0x14) = uVar13;
              *(HighsInt *)(pvVar38 + 2) = HVar15;
              *(undefined8 *)(pvVar38 + 1) = uVar2;
              *(double *)((long)(pvVar38 + 1) + 8) = dVar3;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)((long)(pvVar38 + 2) + 8),pvVar38);
              auVar44._0_8_ =
                   (1.0 - *(double *)((long)(pvVar38 + -4) + 8)) *
                   *(double *)((long)(pvVar38 + -4) + 8);
              auVar44._8_8_ = dVar45;
              uVar2 = *(undefined8 *)(*(long *)CONCAT71(uStack_1c7,leftmost_00) + lVar35 * 8);
              auVar10._8_4_ = (int)uVar2;
              auVar10._0_8_ =
                   *(undefined8 *)
                    (*(long *)CONCAT71(uStack_1c7,leftmost_00) +
                    (long)*(int *)((long)(pvVar38 + -3) + 8) * 8);
              auVar10._12_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar40 = divpd(auVar44,auVar10);
              if ((auVar40._8_8_ <= auVar40._0_8_) &&
                 ((auVar40._8_8_ < auVar40._0_8_ ||
                  (uVar20 = (long)*(int *)((long)(pvVar38 + -3) + 8) + (comp_00.edgeWt)->numTries,
                  uVar26 = uVar20 >> 0x20, uVar20 = uVar20 & 0xffffffff,
                  uVar24 = (comp_00.edgeWt)->numTries + lVar35, uVar27 = uVar24 & 0xffffffff,
                  uVar24 = uVar24 >> 0x20,
                  ((uVar27 + 0x42d8680e260ae5b) * (uVar24 + 0x8a183895eeac1536) ^
                  (uVar24 + 0x80c8963be3e4c2f3) * (uVar27 + 0xc8497d2a400d9551) >> 0x20) <=
                  ((uVar20 + 0x42d8680e260ae5b) * (uVar26 + 0x8a183895eeac1536) ^
                  (uVar26 + 0x80c8963be3e4c2f3) * (uVar20 + 0xc8497d2a400d9551) >> 0x20))))) break;
              pvVar38 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        ((long)(pvVar38 + -3) + 0x10);
            }
            *(pointer *)((long)(pvVar38 + -2) + 0x10) = local_128;
            *(double *)(pvVar38 + -1) = local_198.fractionality;
            *(ulong *)((long)(pvVar38 + -1) + 8) =
                 CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
            *(HighsInt *)((long)(pvVar38 + -1) + 0x10) = (HighsInt)local_118;
            ppVar28 = (pvVar38->
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            (pvVar38->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = local_158;
            (pvVar38->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = ppStack_150;
            (pvVar38->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = local_f8;
            if (ppVar28 != (pointer)0x0) {
              operator_delete(ppVar28);
            }
            end._M_current = (FractionalInteger *)CONCAT71(uStack_1c7,leftmost_00);
            pFVar23 = local_148;
          }
          local_148 = pFVar23;
          pFVar23 = local_148 + 1;
          pvVar36 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    ((long)(pvVar36 + 2) + 8);
        } while (pFVar23 != begin._M_current);
      }
      else {
        if (pFVar23 == begin._M_current || (FractionalInteger *)this == begin._M_current) {
LAB_002ed3c9:
          bVar18 = true;
          goto LAB_002eeb0b;
        }
        ppVar28 = (pointer)0x0;
        _Var29._M_current = (FractionalInteger *)this;
        do {
          local_128 = (pointer)_Var29._M_current[1].fractionality;
          local_118 = (pointer)CONCAT44(local_118._4_4_,_Var29._M_current[1].basisIndex);
          lVar35 = (long)_Var29._M_current[1].basisIndex;
          ppStack_120 = (pointer)0x0;
          dVar45 = (1.0 - (double)local_128) * (double)local_128;
          uVar2 = *(undefined8 *)((long)(end._M_current)->fractionality + lVar35 * 8);
          auVar39._8_8_ = dVar45;
          auVar39._0_8_ =
               (1.0 - (_Var29._M_current)->fractionality) * (_Var29._M_current)->fractionality;
          auVar7._8_4_ = (int)uVar2;
          auVar7._0_8_ = *(undefined8 *)
                          ((long)(end._M_current)->fractionality +
                          (long)(_Var29._M_current)->basisIndex * 8);
          auVar7._12_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar40 = divpd(auVar39,auVar7);
          local_148 = pFVar23;
          if ((auVar40._0_8_ < auVar40._8_8_) ||
             ((auVar40._0_8_ <= auVar40._8_8_ &&
              (uVar20 = (long)(_Var29._M_current)->basisIndex + (comp_00.edgeWt)->numTries,
              uVar26 = uVar20 >> 0x20, uVar20 = uVar20 & 0xffffffff,
              uVar24 = (comp_00.edgeWt)->numTries + lVar35, uVar27 = uVar24 & 0xffffffff,
              uVar24 = uVar24 >> 0x20,
              ((uVar20 + 0x42d8680e260ae5b) * (uVar26 + 0x8a183895eeac1536) ^
              (uVar26 + 0x80c8963be3e4c2f3) * (uVar20 + 0xc8497d2a400d9551) >> 0x20) <
              ((uVar27 + 0x42d8680e260ae5b) * (uVar24 + 0x8a183895eeac1536) ^
              (uVar24 + 0x80c8963be3e4c2f3) * (uVar27 + 0xc8497d2a400d9551) >> 0x20))))) {
            local_198.fractionality = _Var29._M_current[1].row_ep_norm2;
            local_198.row_ep_norm2._0_4_ = SUB84(_Var29._M_current[1].score,0);
            local_198.row_ep_norm2._4_4_ = (undefined4)((ulong)_Var29._M_current[1].score >> 0x20);
            dVar3 = (_Var29._M_current)->fractionality;
            dVar11 = (_Var29._M_current)->row_ep_norm2;
            uVar12 = *(undefined4 *)((long)&(_Var29._M_current)->row_ep_norm2 + 4);
            uVar13 = *(undefined4 *)&(_Var29._M_current)->score;
            uVar14 = *(undefined4 *)((long)&(_Var29._M_current)->score + 4);
            HVar15 = (_Var29._M_current)->basisIndex;
            local_158 = _Var29._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppStack_150 = _Var29._M_current[1].row_ep.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            local_f8 = _Var29._M_current[1].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            _Var29._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            _Var29._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            _Var29._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            _Var34._M_current = pFVar23 + -1;
            *(undefined4 *)((long)&pFVar23->row_ep_norm2 + 4) = uVar12;
            *(undefined4 *)&pFVar23->score = uVar13;
            *(undefined4 *)((long)&pFVar23->score + 4) = uVar14;
            pFVar23->basisIndex = HVar15;
            pFVar23->fractionality = dVar3;
            pFVar23->row_ep_norm2 = dVar11;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(&pFVar23->row_ep,&(_Var29._M_current)->row_ep);
            ppVar5 = ppVar28;
            if (_Var34._M_current != (FractionalInteger *)this) {
              do {
                local_d8 = ppVar5;
                _Var34._M_current =
                     (FractionalInteger *)
                     ((long)&((FractionalInteger *)this)->fractionality + (long)ppVar28);
                dVar3 = *(double *)
                         ((long)&((FractionalInteger *)((long)this + -0x38))->fractionality +
                         (long)ppVar28);
                auVar41._0_8_ = (1.0 - dVar3) * dVar3;
                lVar21 = (long)*(int *)((long)&ppVar28[-2].first +
                                       (long)&((FractionalInteger *)this)->fractionality);
                auVar41._8_8_ = dVar45;
                uVar2 = *(undefined8 *)(*(long *)CONCAT71(uStack_1c7,leftmost_00) + lVar35 * 8);
                auVar8._8_4_ = (int)uVar2;
                auVar8._0_8_ = *(undefined8 *)
                                (*(long *)CONCAT71(uStack_1c7,leftmost_00) + lVar21 * 8);
                auVar8._12_4_ = (int)((ulong)uVar2 >> 0x20);
                auVar40 = divpd(auVar41,auVar8);
                if ((auVar40._8_8_ <= auVar40._0_8_) &&
                   ((auVar40._8_8_ < auVar40._0_8_ ||
                    (uVar20 = lVar21 + (comp_00.edgeWt)->numTries, uVar26 = uVar20 >> 0x20,
                    uVar20 = uVar20 & 0xffffffff, uVar24 = (comp_00.edgeWt)->numTries + lVar35,
                    uVar27 = uVar24 & 0xffffffff, uVar24 = uVar24 >> 0x20,
                    ((uVar27 + 0x42d8680e260ae5b) * (uVar24 + 0x8a183895eeac1536) ^
                    (uVar24 + 0x80c8963be3e4c2f3) * (uVar27 + 0xc8497d2a400d9551) >> 0x20) <=
                    ((uVar20 + 0x42d8680e260ae5b) * (uVar26 + 0x8a183895eeac1536) ^
                    (uVar26 + 0x80c8963be3e4c2f3) * (uVar20 + 0xc8497d2a400d9551) >> 0x20)))))
                break;
                pdVar22 = (double *)
                          ((long)&((FractionalInteger *)((long)this + -0x38))->fractionality +
                          (long)ppVar28);
                dVar3 = *pdVar22;
                dVar11 = pdVar22[1];
                uVar12 = *(undefined4 *)(pdVar22 + 2);
                uVar13 = *(undefined4 *)((long)pdVar22 + 0x14);
                HVar15 = *(HighsInt *)(pdVar22 + 3);
                *(undefined4 *)((long)&(_Var34._M_current)->row_ep_norm2 + 4) =
                     *(undefined4 *)((long)pdVar22 + 0xc);
                *(undefined4 *)&(_Var34._M_current)->score = uVar12;
                *(undefined4 *)((long)&(_Var34._M_current)->score + 4) = uVar13;
                (_Var34._M_current)->basisIndex = HVar15;
                (_Var34._M_current)->fractionality = dVar3;
                (_Var34._M_current)->row_ep_norm2 = dVar11;
                std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                _M_move_assign((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                *)((long)&ppVar28->first +
                                  (long)&(((FractionalInteger *)this)->row_ep).
                                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start),
                               (long)&ppVar28[-2].second + (long)this);
                ppVar28 = (pointer)&ppVar28[-4].second;
                _Var34._M_current = (FractionalInteger *)this;
                ppVar5 = local_d8;
              } while (ppVar28 != (pointer)0x0);
              pFVar23 = (FractionalInteger *)
                        ((long)&((FractionalInteger *)((long)this + 0x38))->fractionality +
                        (long)ppVar28);
              ppVar28 = local_d8;
            }
            (_Var34._M_current)->fractionality = (double)local_128;
            pFVar23[-1].row_ep_norm2 = local_198.fractionality;
            pFVar23[-1].score =
                 (double)CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
            pFVar23[-1].basisIndex = (HighsInt)local_118;
            ppVar5 = pFVar23[-1].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pFVar23[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = local_158;
            pFVar23[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppStack_150;
            pFVar23[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = local_f8;
            if (ppVar5 != (pointer)0x0) {
              operator_delete(ppVar5);
            }
            end._M_current = (FractionalInteger *)CONCAT71(uStack_1c7,leftmost_00);
          }
          pFVar23 = local_148 + 1;
          ppVar28 = (pointer)&ppVar28[3].second;
          _Var29._M_current = local_148;
        } while (pFVar23 != begin._M_current);
      }
      bVar18 = true;
    }
    else {
      local_158 = (pointer)(((long)local_128 >> 3) * 0x6db6db6db6db6db7);
      uVar20 = (ulong)local_158 >> 1;
      _Var29._M_current = (FractionalInteger *)((long)this + uVar20 * 0x38);
      if ((long)local_128 < 0x1c01) {
        _Var34._M_current._1_7_ = uStack_1c7;
        _Var34._M_current._0_1_ = leftmost_00;
        comp_07.this = (HighsTableauSeparator *)begin._M_current;
        comp_07.edgeWt = (double **)comp_00.edgeWt;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  ((pdqsort_detail *)_Var29._M_current,
                   (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    )this,local_e0,_Var34,comp_07);
      }
      else {
        c._M_current._1_7_ = uStack_1c7;
        c._M_current._0_1_ = leftmost_00;
        comp_03.this = (HighsTableauSeparator *)begin._M_current;
        comp_03.edgeWt = (double **)comp_00.edgeWt;
        _Var34._M_current = begin._M_current;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  (this,_Var29,local_e0,c,comp_03);
        comp_04.this = (HighsTableauSeparator *)_Var34._M_current;
        comp_04.edgeWt = (double **)comp_00.edgeWt;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  ((pdqsort_detail *)((long)this + 0x38),
                   (FractionalInteger *)((long)this + (uVar20 - 1) * 0x38),local_a0,c,comp_04);
        comp_05.this = (HighsTableauSeparator *)_Var34._M_current;
        comp_05.edgeWt = (double **)comp_00.edgeWt;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  ((pdqsort_detail *)((long)this + 0x70),
                   (FractionalInteger *)((long)this + (uVar20 + 1) * 0x38),local_a8,c,comp_05);
        c_00._M_current._1_7_ = uStack_1c7;
        c_00._M_current._0_1_ = leftmost_00;
        comp_06.this = (HighsTableauSeparator *)_Var34._M_current;
        comp_06.edgeWt = (double **)comp_00.edgeWt;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  ((pdqsort_detail *)((long)this + (uVar20 - 1) * 0x38),_Var29,
                   (FractionalInteger *)((long)this + (uVar20 + 1) * 0x38),c_00,comp_06);
        local_198.fractionality = ((FractionalInteger *)this)->fractionality;
        local_198._20_8_ = *(undefined8 *)((long)&((FractionalInteger *)this)->score + 4);
        local_198.score._0_4_ =
             (undefined4)
             ((ulong)*(undefined8 *)((long)&((FractionalInteger *)this)->row_ep_norm2 + 4) >> 0x20);
        local_198.row_ep_norm2._0_4_ = SUB84(((FractionalInteger *)this)->row_ep_norm2,0);
        local_198.row_ep_norm2._4_4_ =
             (undefined4)((ulong)((FractionalInteger *)this)->row_ep_norm2 >> 0x20);
        ppVar28 = (((FractionalInteger *)this)->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar16 = (((FractionalInteger *)this)->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar17 = (((FractionalInteger *)this)->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dVar45 = (_Var29._M_current)->row_ep_norm2;
        uVar12 = *(undefined4 *)((long)&(_Var29._M_current)->row_ep_norm2 + 4);
        uVar13 = *(undefined4 *)&(_Var29._M_current)->score;
        uVar14 = *(undefined4 *)((long)&(_Var29._M_current)->score + 4);
        HVar15 = (_Var29._M_current)->basisIndex;
        ((FractionalInteger *)this)->fractionality = (_Var29._M_current)->fractionality;
        ((FractionalInteger *)this)->row_ep_norm2 = dVar45;
        *(undefined4 *)((long)&((FractionalInteger *)this)->row_ep_norm2 + 4) = uVar12;
        *(undefined4 *)&((FractionalInteger *)this)->score = uVar13;
        *(undefined4 *)((long)&((FractionalInteger *)this)->score + 4) = uVar14;
        ((FractionalInteger *)this)->basisIndex = HVar15;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        _M_move_assign(&((FractionalInteger *)this)->row_ep,&(_Var29._M_current)->row_ep);
        *(ulong *)((long)&(_Var29._M_current)->row_ep_norm2 + 4) =
             CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
        *(undefined8 *)((long)&(_Var29._M_current)->score + 4) = local_198._20_8_;
        (_Var29._M_current)->fractionality = local_198.fractionality;
        (_Var29._M_current)->row_ep_norm2 =
             (double)CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
        ppVar5 = ((_Var29._M_current)->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ((_Var29._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = ppVar16;
        ((_Var29._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar17;
        ((_Var29._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = ppVar28;
        if (ppVar5 != (pointer)0x0) {
          operator_delete(ppVar5);
        }
      }
      if ((local_12c & 1) == 0) {
        iVar4 = ((FractionalInteger *)this)->basisIndex;
        local_148 = (FractionalInteger *)(long)iVar4;
        auVar42._0_8_ =
             (1.0 - ((FractionalInteger *)this)->fractionality) *
             ((FractionalInteger *)this)->fractionality;
        auVar42._8_8_ =
             (1.0 - ((FractionalInteger *)((long)this + -0x38))->fractionality) *
             ((FractionalInteger *)((long)this + -0x38))->fractionality;
        uVar2 = *(undefined8 *)
                 (*(long *)CONCAT71(uStack_1c7,leftmost_00) +
                 (long)((FractionalInteger *)((long)this + -0x38))->basisIndex * 8);
        auVar40._8_4_ = (int)uVar2;
        auVar40._0_8_ =
             *(undefined8 *)(*(long *)CONCAT71(uStack_1c7,leftmost_00) + (long)local_148 * 8);
        auVar40._12_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar40 = divpd(auVar42,auVar40);
        if ((auVar40._0_8_ < auVar40._8_8_) ||
           ((auVar40._0_8_ <= auVar40._8_8_ &&
            (uVar20 = (long)&local_148->fractionality + (comp_00.edgeWt)->numTries,
            uVar26 = uVar20 & 0xffffffff, uVar20 = uVar20 >> 0x20,
            uVar24 = (long)((FractionalInteger *)((long)this + -0x38))->basisIndex +
                     (comp_00.edgeWt)->numTries, uVar27 = uVar24 >> 0x20,
            uVar24 = uVar24 & 0xffffffff,
            ((uVar26 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
            (uVar20 + 0x80c8963be3e4c2f3) * (uVar26 + 0xc8497d2a400d9551) >> 0x20) <
            ((uVar24 + 0x42d8680e260ae5b) * (uVar27 + 0x8a183895eeac1536) ^
            (uVar27 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20)))))
        goto LAB_002ed4d9;
        local_d8 = (pointer)((FractionalInteger *)this)->fractionality;
        local_88 = ((FractionalInteger *)this)->row_ep_norm2;
        uStack_80 = SUB84(((FractionalInteger *)this)->score,0);
        uStack_7c = (undefined4)((ulong)((FractionalInteger *)this)->score >> 0x20);
        local_158 = (((FractionalInteger *)this)->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppStack_150 = (((FractionalInteger *)this)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        local_f8 = (((FractionalInteger *)this)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_118 = (pointer)((1.0 - (double)local_d8) * (double)local_d8);
        lVar35 = *(long *)CONCAT71(uStack_1c7,leftmost_00);
        dVar45 = (double)local_118 / *(double *)(lVar35 + (long)local_148 * 8);
        lVar21 = (comp_00.edgeWt)->numTries;
        uVar20 = (long)&local_148->fractionality + lVar21;
        uVar24 = uVar20 & 0xffffffff;
        uVar20 = uVar20 >> 0x20;
        local_c8 = (pointer)&((FractionalInteger *)this)->row_ep;
        uVar20 = (uVar20 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20 ^
                 (uVar20 + 0x8a183895eeac1536) * (uVar24 + 0x42d8680e260ae5b);
        lVar30 = 0;
        while( true ) {
          dVar3 = *(double *)((long)&(local_e0._M_current)->fractionality + lVar30);
          lVar32 = (long)*(int *)((long)&(local_e0._M_current)->basisIndex + lVar30);
          dVar3 = ((1.0 - dVar3) * dVar3) / *(double *)(lVar35 + lVar32 * 8);
          if ((dVar45 <= dVar3) &&
             ((dVar45 < dVar3 ||
              (uVar24 = lVar32 + lVar21, uVar26 = uVar24 >> 0x20, uVar24 = uVar24 & 0xffffffff,
              uVar20 <= ((uVar24 + 0x42d8680e260ae5b) * (uVar26 + 0x8a183895eeac1536) ^
                        (uVar26 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20)))))
          break;
          lVar30 = lVar30 + -0x38;
        }
        local_128 = (pointer)CONCAT44(local_128._4_4_,iVar4);
        pFVar23 = (FractionalInteger *)((long)&(local_e0._M_current)->fractionality + lVar30);
        if (lVar30 == 0) {
          pFVar25 = (FractionalInteger *)((long)this + 0x38);
          while (pFVar31 = pFVar25, pFVar37 = pFVar31 + -1, pFVar31 + -1 < pFVar23) {
            dVar3 = ((1.0 - pFVar31->fractionality) * pFVar31->fractionality) /
                    *(double *)(lVar35 + (long)pFVar31->basisIndex * 8);
            pFVar37 = pFVar31;
            if ((dVar3 < dVar45) ||
               ((pFVar25 = pFVar31 + 1, dVar3 <= dVar45 &&
                (uVar24 = pFVar31->basisIndex + lVar21, uVar26 = uVar24 >> 0x20,
                uVar24 = uVar24 & 0xffffffff,
                ((uVar24 + 0x42d8680e260ae5b) * (uVar26 + 0x8a183895eeac1536) ^
                (uVar26 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20) < uVar20))))
            break;
          }
        }
        else {
          pFVar25 = (FractionalInteger *)((long)this + 0x38);
          do {
            pFVar37 = pFVar25;
            dVar3 = ((1.0 - pFVar37->fractionality) * pFVar37->fractionality) /
                    *(double *)(lVar35 + (long)pFVar37->basisIndex * 8);
            if (dVar3 < dVar45) break;
            pFVar25 = pFVar37 + 1;
          } while ((dVar45 < dVar3) ||
                  (uVar24 = pFVar37->basisIndex + lVar21, uVar26 = uVar24 >> 0x20,
                  uVar24 = uVar24 & 0xffffffff,
                  uVar20 <= ((uVar24 + 0x42d8680e260ae5b) * (uVar26 + 0x8a183895eeac1536) ^
                            (uVar26 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20)))
          ;
        }
        if (pFVar37 < pFVar23) {
          do {
            local_198.fractionality = pFVar37->fractionality;
            local_198._20_8_ = *(undefined8 *)((long)&pFVar37->score + 4);
            local_198.score._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)&pFVar37->row_ep_norm2 + 4) >> 0x20);
            local_198.row_ep_norm2._0_4_ = SUB84(pFVar37->row_ep_norm2,0);
            local_198.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar37->row_ep_norm2 >> 0x20);
            ppVar28 = (pFVar37->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar16 = (pFVar37->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar17 = (pFVar37->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (pFVar37->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pFVar37->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pFVar37->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            dVar45 = pFVar23->row_ep_norm2;
            uVar12 = *(undefined4 *)((long)&pFVar23->row_ep_norm2 + 4);
            uVar13 = *(undefined4 *)&pFVar23->score;
            uVar14 = *(undefined4 *)((long)&pFVar23->score + 4);
            HVar15 = pFVar23->basisIndex;
            pFVar37->fractionality = pFVar23->fractionality;
            pFVar37->row_ep_norm2 = dVar45;
            *(undefined4 *)((long)&pFVar37->row_ep_norm2 + 4) = uVar12;
            *(undefined4 *)&pFVar37->score = uVar13;
            *(undefined4 *)((long)&pFVar37->score + 4) = uVar14;
            pFVar37->basisIndex = HVar15;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(&pFVar37->row_ep,&pFVar23->row_ep);
            *(ulong *)((long)&pFVar23->row_ep_norm2 + 4) =
                 CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
            *(undefined8 *)((long)&pFVar23->score + 4) = local_198._20_8_;
            pFVar23->fractionality = local_198.fractionality;
            pFVar23->row_ep_norm2 =
                 (double)CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
            ppVar5 = (pFVar23->row_ep).
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            (pFVar23->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar16;
            (pFVar23->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar17;
            (pFVar23->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
            if (ppVar5 != (pointer)0x0) {
              operator_delete(ppVar5);
            }
            lVar35 = *(long *)CONCAT71(uStack_1c7,leftmost_00);
            dVar45 = (double)local_118 / *(double *)(lVar35 + (long)local_148 * 8);
            lVar21 = (comp_00.edgeWt)->numTries;
            uVar20 = (long)&local_148->fractionality + lVar21;
            uVar24 = uVar20 & 0xffffffff;
            uVar20 = uVar20 >> 0x20;
            uVar20 = (uVar20 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20 ^
                     (uVar20 + 0x8a183895eeac1536) * (uVar24 + 0x42d8680e260ae5b);
            pFVar25 = pFVar23;
            do {
              do {
                pFVar23 = pFVar25 + -1;
                pFVar31 = pFVar25 + -1;
                dVar3 = ((1.0 - pFVar23->fractionality) * pFVar23->fractionality) /
                        *(double *)(lVar35 + (long)pFVar31->basisIndex * 8);
                pFVar25 = pFVar23;
              } while (dVar3 < dVar45);
            } while ((dVar3 <= dVar45) &&
                    (uVar24 = pFVar31->basisIndex + lVar21, uVar26 = uVar24 >> 0x20,
                    uVar24 = uVar24 & 0xffffffff,
                    ((uVar24 + 0x42d8680e260ae5b) * (uVar26 + 0x8a183895eeac1536) ^
                    (uVar26 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20) < uVar20)
                    );
            pFVar25 = pFVar37 + 1;
            do {
              pFVar37 = pFVar25;
              dVar3 = ((1.0 - pFVar37->fractionality) * pFVar37->fractionality) /
                      *(double *)(lVar35 + (long)pFVar37->basisIndex * 8);
              if (dVar3 < dVar45) break;
              pFVar25 = pFVar37 + 1;
            } while ((dVar45 < dVar3) ||
                    (uVar24 = pFVar37->basisIndex + lVar21, uVar26 = uVar24 >> 0x20,
                    uVar24 = uVar24 & 0xffffffff,
                    uVar20 <= ((uVar24 + 0x42d8680e260ae5b) * (uVar26 + 0x8a183895eeac1536) ^
                              (uVar26 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20)
                    ));
          } while (pFVar37 < pFVar23);
        }
        dVar45 = pFVar23->fractionality;
        dVar3 = pFVar23->row_ep_norm2;
        uVar12 = *(undefined4 *)&pFVar23->score;
        uVar13 = *(undefined4 *)((long)&pFVar23->score + 4);
        HVar15 = pFVar23->basisIndex;
        *(undefined4 *)((long)&((FractionalInteger *)this)->row_ep_norm2 + 4) =
             *(undefined4 *)((long)&pFVar23->row_ep_norm2 + 4);
        *(undefined4 *)&((FractionalInteger *)this)->score = uVar12;
        *(undefined4 *)((long)&((FractionalInteger *)this)->score + 4) = uVar13;
        ((FractionalInteger *)this)->basisIndex = HVar15;
        ((FractionalInteger *)this)->fractionality = dVar45;
        ((FractionalInteger *)this)->row_ep_norm2 = dVar3;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        _M_move_assign((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       local_c8,&pFVar23->row_ep);
        pFVar23->fractionality = (double)local_d8;
        pFVar23->row_ep_norm2 = local_88;
        pFVar23->score = (double)CONCAT44(uStack_7c,uStack_80);
        pFVar23->basisIndex = (HighsInt)local_128;
        ppVar28 = (pFVar23->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (pFVar23->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = local_158;
        (pFVar23->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppStack_150;
        (pFVar23->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = local_f8;
        if (ppVar28 != (pointer)0x0) {
          operator_delete(ppVar28);
        }
        this = (pdqsort_detail *)(pFVar23 + 1);
        bVar18 = false;
LAB_002eeaf8:
        end._M_current = (FractionalInteger *)CONCAT71(uStack_1c7,leftmost_00);
      }
      else {
LAB_002ed4d9:
        local_d8 = (pointer)((FractionalInteger *)this)->fractionality;
        local_88 = ((FractionalInteger *)this)->row_ep_norm2;
        uStack_80 = SUB84(((FractionalInteger *)this)->score,0);
        uStack_7c = (undefined4)((ulong)((FractionalInteger *)this)->score >> 0x20);
        iVar4 = ((FractionalInteger *)this)->basisIndex;
        local_48 = (((FractionalInteger *)this)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppStack_40 = (((FractionalInteger *)this)->row_ep).
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        local_50 = (((FractionalInteger *)this)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (((FractionalInteger *)this)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar35 = *(long *)CONCAT71(uStack_1c7,leftmost_00);
        local_148 = (FractionalInteger *)((1.0 - (double)local_d8) * (double)local_d8);
        local_c8 = (pointer)CONCAT44(local_c8._4_4_,iVar4);
        local_118 = (pointer)(long)iVar4;
        dVar45 = (double)local_148 / *(double *)(lVar35 + (long)local_118 * 8);
        lVar21 = (comp_00.edgeWt)->numTries;
        uVar20 = (long)&local_118->first + lVar21;
        uVar24 = uVar20 & 0xffffffff;
        uVar20 = uVar20 >> 0x20;
        pHVar33 = (HighsTableauSeparator *)
                  ((uVar20 + 0x8a183895eeac1536) * (uVar24 + 0x42d8680e260ae5b));
        local_f8 = (pointer)&((FractionalInteger *)this)->row_ep;
        uVar20 = (uVar20 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20 ^
                 (ulong)pHVar33;
        lVar30 = 0x38;
        while( true ) {
          dVar3 = *(double *)((long)&((FractionalInteger *)this)->fractionality + lVar30);
          lVar32 = (long)*(int *)((long)&((FractionalInteger *)this)->basisIndex + lVar30);
          dVar3 = ((1.0 - dVar3) * dVar3) / *(double *)(lVar35 + lVar32 * 8);
          if ((dVar3 <= dVar45) &&
             ((dVar3 < dVar45 ||
              (uVar24 = lVar32 + lVar21, uVar26 = uVar24 >> 0x20, uVar24 = uVar24 & 0xffffffff,
              pHVar33 = (HighsTableauSeparator *)(uVar26 + 0x8a183895eeac1536),
              ((uVar24 + 0x42d8680e260ae5b) * (long)pHVar33 ^
              (uVar26 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20) <= uVar20))))
          break;
          lVar30 = lVar30 + 0x38;
        }
        pFVar23 = (FractionalInteger *)((long)&((FractionalInteger *)this)->fractionality + lVar30);
        _Var29._M_current = local_e0._M_current;
        if (lVar30 == 0x38) {
          while (pFVar37 = _Var29._M_current, pFVar25 = pFVar37 + 1, pFVar23 < pFVar37 + 1) {
            dVar3 = ((1.0 - pFVar37->fractionality) * pFVar37->fractionality) /
                    *(double *)(lVar35 + (long)pFVar37->basisIndex * 8);
            pFVar25 = pFVar37;
            if ((dVar45 < dVar3) ||
               ((_Var29._M_current = pFVar37 + -1, dVar45 <= dVar3 &&
                (uVar24 = pFVar37->basisIndex + lVar21, uVar26 = uVar24 >> 0x20,
                uVar24 = uVar24 & 0xffffffff,
                pHVar33 = (HighsTableauSeparator *)(uVar26 + 0x8a183895eeac1536),
                uVar20 < ((uVar24 + 0x42d8680e260ae5b) * (long)pHVar33 ^
                         (uVar26 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20)))))
            break;
          }
        }
        else {
          do {
            pFVar25 = _Var29._M_current;
            dVar3 = ((1.0 - pFVar25->fractionality) * pFVar25->fractionality) /
                    *(double *)(lVar35 + (long)pFVar25->basisIndex * 8);
            if (dVar45 < dVar3) break;
            _Var29._M_current = pFVar25 + -1;
          } while ((dVar3 < dVar45) ||
                  (uVar24 = pFVar25->basisIndex + lVar21, uVar26 = uVar24 >> 0x20,
                  uVar24 = uVar24 & 0xffffffff,
                  pHVar33 = (HighsTableauSeparator *)(uVar26 + 0x8a183895eeac1536),
                  ((uVar24 + 0x42d8680e260ae5b) * (long)pHVar33 ^
                  (uVar26 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20) <= uVar20))
          ;
        }
        local_98 = pFVar25;
        local_90 = pFVar23;
        if (pFVar23 < pFVar25) {
          do {
            local_198.fractionality = pFVar23->fractionality;
            local_198._20_8_ = *(undefined8 *)((long)&pFVar23->score + 4);
            local_198.score._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)&pFVar23->row_ep_norm2 + 4) >> 0x20);
            local_198.row_ep_norm2._0_4_ = SUB84(pFVar23->row_ep_norm2,0);
            local_198.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar23->row_ep_norm2 >> 0x20);
            ppVar28 = (pFVar23->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar16 = (pFVar23->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar17 = (pFVar23->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (pFVar23->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pFVar23->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pFVar23->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            dVar45 = pFVar25->row_ep_norm2;
            uVar12 = *(undefined4 *)((long)&pFVar25->row_ep_norm2 + 4);
            uVar13 = *(undefined4 *)&pFVar25->score;
            uVar14 = *(undefined4 *)((long)&pFVar25->score + 4);
            HVar15 = pFVar25->basisIndex;
            pFVar23->fractionality = pFVar25->fractionality;
            pFVar23->row_ep_norm2 = dVar45;
            *(undefined4 *)((long)&pFVar23->row_ep_norm2 + 4) = uVar12;
            *(undefined4 *)&pFVar23->score = uVar13;
            *(undefined4 *)((long)&pFVar23->score + 4) = uVar14;
            pFVar23->basisIndex = HVar15;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(&pFVar23->row_ep,&pFVar25->row_ep);
            *(ulong *)((long)&pFVar25->row_ep_norm2 + 4) =
                 CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
            *(undefined8 *)((long)&pFVar25->score + 4) = local_198._20_8_;
            pFVar25->fractionality = local_198.fractionality;
            pFVar25->row_ep_norm2 =
                 (double)CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
            ppVar5 = (pFVar25->row_ep).
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            (pFVar25->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar16;
            (pFVar25->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar17;
            (pFVar25->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
            if (ppVar5 != (pointer)0x0) {
              operator_delete(ppVar5);
            }
            lVar35 = *(long *)CONCAT71(uStack_1c7,leftmost_00);
            dVar45 = (double)local_148 / *(double *)(lVar35 + (long)local_118 * 8);
            lVar21 = (comp_00.edgeWt)->numTries;
            uVar20 = (long)&local_118->first + lVar21;
            uVar24 = uVar20 & 0xffffffff;
            uVar20 = uVar20 >> 0x20;
            pHVar33 = (HighsTableauSeparator *)
                      ((uVar20 + 0x8a183895eeac1536) * (uVar24 + 0x42d8680e260ae5b));
            uVar20 = (uVar20 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20 ^
                     (ulong)pHVar33;
            pFVar37 = pFVar23;
            do {
              do {
                pFVar23 = pFVar37 + 1;
                pFVar31 = pFVar37 + 1;
                dVar3 = ((1.0 - pFVar23->fractionality) * pFVar23->fractionality) /
                        *(double *)(lVar35 + (long)pFVar31->basisIndex * 8);
                pFVar37 = pFVar23;
              } while (dVar45 < dVar3);
            } while ((dVar45 <= dVar3) &&
                    (uVar24 = pFVar31->basisIndex + lVar21, uVar26 = uVar24 >> 0x20,
                    uVar24 = uVar24 & 0xffffffff,
                    pHVar33 = (HighsTableauSeparator *)
                              ((uVar26 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20
                              ),
                    uVar20 < ((uVar24 + 0x42d8680e260ae5b) * (uVar26 + 0x8a183895eeac1536) ^
                             (ulong)pHVar33)));
            pFVar37 = pFVar25 + -1;
            do {
              pFVar25 = pFVar37;
              dVar3 = ((1.0 - pFVar25->fractionality) * pFVar25->fractionality) /
                      *(double *)(lVar35 + (long)pFVar25->basisIndex * 8);
              if (dVar45 < dVar3) break;
              pFVar37 = pFVar25 + -1;
            } while ((dVar3 < dVar45) ||
                    (uVar24 = pFVar25->basisIndex + lVar21, uVar26 = uVar24 >> 0x20,
                    uVar24 = uVar24 & 0xffffffff,
                    pHVar33 = (HighsTableauSeparator *)(uVar26 + 0x8a183895eeac1536),
                    ((uVar24 + 0x42d8680e260ae5b) * (long)pHVar33 ^
                    (uVar26 + 0x80c8963be3e4c2f3) * (uVar24 + 0xc8497d2a400d9551) >> 0x20) <= uVar20
                    ));
          } while (pFVar23 < pFVar25);
        }
        dVar45 = pFVar23[-1].fractionality;
        dVar3 = pFVar23[-1].row_ep_norm2;
        uVar12 = *(undefined4 *)&pFVar23[-1].score;
        uVar13 = *(undefined4 *)((long)&pFVar23[-1].score + 4);
        HVar15 = pFVar23[-1].basisIndex;
        *(undefined4 *)((long)&((FractionalInteger *)this)->row_ep_norm2 + 4) =
             *(undefined4 *)((long)&pFVar23[-1].row_ep_norm2 + 4);
        *(undefined4 *)&((FractionalInteger *)this)->score = uVar12;
        *(undefined4 *)((long)&((FractionalInteger *)this)->score + 4) = uVar13;
        ((FractionalInteger *)this)->basisIndex = HVar15;
        ((FractionalInteger *)this)->fractionality = dVar45;
        ((FractionalInteger *)this)->row_ep_norm2 = dVar3;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        _M_move_assign((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       local_f8,&pFVar23[-1].row_ep);
        pFVar23[-1].fractionality = (double)local_d8;
        pFVar23[-1].row_ep_norm2 = local_88;
        pFVar23[-1].score = (double)CONCAT44(uStack_7c,uStack_80);
        pFVar23[-1].basisIndex = (HighsInt)local_c8;
        ppVar28 = pFVar23[-1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pFVar23[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = local_48;
        pFVar23[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppStack_40;
        pFVar23[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = local_50;
        if (ppVar28 != (pointer)0x0) {
          operator_delete(ppVar28);
        }
        _Var29._M_current = pFVar23 + -1;
        lVar35 = (long)_Var29._M_current - (long)this;
        uVar20 = (lVar35 >> 3) * 0x6db6db6db6db6db7;
        ppVar28 = (pointer)((long)begin._M_current - (long)pFVar23);
        pFVar25 = (FractionalInteger *)(((long)ppVar28 >> 3) * 0x6db6db6db6db6db7);
        if (((long)uVar20 < (long)((ulong)local_158 >> 3)) ||
           ((long)pFVar25 < (long)((ulong)local_158 >> 3))) {
          local_fc = local_fc + -1;
          if (local_fc == 0) {
            lVar35 = (long)local_158 + (-2 - ((long)((long)&local_158[-1].second + 6) >> 0x3f)) >> 1
            ;
            __comp_00._M_comp.edgeWt._1_7_ = uStack_1c7;
            __comp_00._M_comp.edgeWt._0_1_ = leftmost_00;
            local_fc = 0;
            do {
              local_198.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (((FractionalInteger *)((long)this + lVar35 * 0x38))->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_198.fractionality =
                   ((FractionalInteger *)((long)this + lVar35 * 0x38))->fractionality;
              dVar45 = ((FractionalInteger *)((long)this + lVar35 * 0x38))->row_ep_norm2;
              puVar1 = (undefined8 *)
                       ((long)&((FractionalInteger *)((long)this + lVar35 * 0x38))->row_ep_norm2 + 4
                       );
              uVar2 = *puVar1;
              local_198._20_8_ = puVar1[1];
              local_198.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (((FractionalInteger *)((long)this + lVar35 * 0x38))->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_198.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (((FractionalInteger *)((long)this + lVar35 * 0x38))->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              (((FractionalInteger *)((long)this + lVar35 * 0x38))->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (((FractionalInteger *)((long)this + lVar35 * 0x38))->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (((FractionalInteger *)((long)this + lVar35 * 0x38))->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_198.score._0_4_ = (undefined4)((ulong)uVar2 >> 0x20);
              local_198.row_ep_norm2._0_4_ = SUB84(dVar45,0);
              local_198.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar45 >> 0x20);
              __comp_00._M_comp.this = comp_00.edgeWt;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,long,FractionalInteger,__gnu_cxx::__ops::_Iter_comp_iter<HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>>
                        ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          )this,lVar35,(long)local_158,&local_198,__comp_00);
              if (local_198.row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_198.row_ep.
                                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              bVar18 = lVar35 != 0;
              lVar35 = lVar35 + -1;
              pvVar36 = local_b0;
            } while (bVar18);
            do {
              local_88 = *(double *)((long)(pvVar36 + -2) + 0x10);
              uStack_74 = *(undefined8 *)((long)(pvVar36 + -1) + 0xc);
              uStack_78 = (undefined4)((ulong)*(undefined8 *)((long)(pvVar36 + -1) + 4) >> 0x20);
              uStack_80 = SUB84(*(double *)(pvVar36 + -1),0);
              uStack_7c = (undefined4)((ulong)*(double *)(pvVar36 + -1) >> 0x20);
              ppVar28 = (pvVar36->
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_128 = (pointer)&local_128[-4].second;
              lVar35 = (long)local_128 >> 3;
              ppVar5 = (pvVar36->
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              ppVar16 = (pvVar36->
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              (pvVar36->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (pvVar36->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (pvVar36->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              dVar45 = ((FractionalInteger *)this)->row_ep_norm2;
              uVar12 = *(undefined4 *)((long)&((FractionalInteger *)this)->row_ep_norm2 + 4);
              uVar13 = *(undefined4 *)&((FractionalInteger *)this)->score;
              uVar14 = *(undefined4 *)((long)&((FractionalInteger *)this)->score + 4);
              HVar15 = ((FractionalInteger *)this)->basisIndex;
              *(double *)((long)(pvVar36 + -2) + 0x10) = ((FractionalInteger *)this)->fractionality;
              *(double *)(pvVar36 + -1) = dVar45;
              *(undefined4 *)((long)(pvVar36 + -1) + 4) = uVar12;
              *(undefined4 *)((long)(pvVar36 + -1) + 8) = uVar13;
              *(undefined4 *)((long)(pvVar36 + -1) + 0xc) = uVar14;
              *(HighsInt *)((long)(pvVar36 + -1) + 0x10) = HVar15;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign(pvVar36);
              local_198.score._0_4_ = uStack_78;
              local_198._20_8_ = uStack_74;
              local_198.fractionality = local_88;
              local_198.row_ep_norm2._0_4_ = uStack_80;
              local_198.row_ep_norm2._4_4_ = uStack_7c;
              __comp._M_comp.edgeWt._1_7_ = uStack_1c7;
              __comp._M_comp.edgeWt._0_1_ = leftmost_00;
              __comp._M_comp.this = comp_00.edgeWt;
              local_198.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar5;
              local_198.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar16;
              local_198.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,long,FractionalInteger,__gnu_cxx::__ops::_Iter_comp_iter<HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>>
                        ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          )this,0,lVar35 * 0x6db6db6db6db6db7,&local_198,__comp);
              if (local_198.row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_198.row_ep.
                                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              pvVar36 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        ((long)(pvVar36 + -3) + 0x10);
            } while (0x38 < (long)local_128);
            local_fc = 0;
            bVar18 = true;
            goto LAB_002eeaf8;
          }
          local_118 = ppVar28;
          if (0x508 < lVar35) {
            local_128 = (pointer)(uVar20 >> 2);
            local_158 = (pointer)((long)local_128 * 0x38);
            local_198.fractionality = ((FractionalInteger *)this)->fractionality;
            local_198._20_8_ = *(undefined8 *)((long)&((FractionalInteger *)this)->score + 4);
            local_198.score._0_4_ =
                 (undefined4)
                 ((ulong)*(undefined8 *)((long)&((FractionalInteger *)this)->row_ep_norm2 + 4) >>
                 0x20);
            local_198.row_ep_norm2._0_4_ = SUB84(((FractionalInteger *)this)->row_ep_norm2,0);
            local_198.row_ep_norm2._4_4_ =
                 (undefined4)((ulong)((FractionalInteger *)this)->row_ep_norm2 >> 0x20);
            local_d8 = (((FractionalInteger *)this)->row_ep).
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar36 = &((FractionalInteger *)((long)this + local_128 * 0x38))->row_ep;
            local_c8 = (((FractionalInteger *)this)->row_ep).
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppStack_c0 = (((FractionalInteger *)this)->row_ep).
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            *(undefined8 *)local_f8 = 0;
            local_f8->second = 0.0;
            *(undefined8 *)(local_f8 + 1) = 0;
            dVar45 = *(double *)((long)(pvVar36 + -2) + 0x10);
            dVar3 = *(double *)(pvVar36 + -1);
            uVar12 = *(undefined4 *)((long)(pvVar36 + -1) + 8);
            uVar13 = *(undefined4 *)((long)(pvVar36 + -1) + 0xc);
            HVar15 = *(HighsInt *)((long)(pvVar36 + -1) + 0x10);
            *(undefined4 *)((long)&((FractionalInteger *)this)->row_ep_norm2 + 4) =
                 *(undefined4 *)((long)(pvVar36 + -1) + 4);
            *(undefined4 *)&((FractionalInteger *)this)->score = uVar12;
            *(undefined4 *)((long)&((FractionalInteger *)this)->score + 4) = uVar13;
            ((FractionalInteger *)this)->basisIndex = HVar15;
            ((FractionalInteger *)this)->fractionality = dVar45;
            ((FractionalInteger *)this)->row_ep_norm2 = dVar3;
            local_148 = pFVar25;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            *)local_f8,pvVar36);
            *(ulong *)((long)(pvVar36 + -1) + 4) =
                 CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
            *(undefined8 *)((long)(pvVar36 + -1) + 0xc) = local_198._20_8_;
            *(double *)((long)(pvVar36 + -2) + 0x10) = local_198.fractionality;
            *(ulong *)(pvVar36 + -1) =
                 CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
            ppVar28 = (pvVar36->
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            (pvVar36->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = local_c8;
            (pvVar36->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = ppStack_c0;
            (pvVar36->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = local_d8;
            if (ppVar28 != (pointer)0x0) {
              operator_delete(ppVar28);
            }
            local_198.fractionality = pFVar23[-2].fractionality;
            local_198._20_8_ = *(undefined8 *)((long)&pFVar23[-2].score + 4);
            local_198.score._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)&pFVar23[-2].row_ep_norm2 + 4) >> 0x20);
            local_198.row_ep_norm2._0_4_ = SUB84(pFVar23[-2].row_ep_norm2,0);
            local_198.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar23[-2].row_ep_norm2 >> 0x20);
            local_f8 = pFVar23[-2].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar36 = &pFVar23[-1 - (long)local_128].row_ep;
            local_d8 = pFVar23[-2].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppStack_d0 = pFVar23[-2].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            pFVar23[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            pFVar23[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            pFVar23[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            dVar45 = *(double *)(pvVar36 + -1);
            uVar12 = *(undefined4 *)((long)(pvVar36 + -1) + 4);
            uVar13 = *(undefined4 *)((long)(pvVar36 + -1) + 8);
            uVar14 = *(undefined4 *)((long)(pvVar36 + -1) + 0xc);
            HVar15 = *(HighsInt *)((long)(pvVar36 + -1) + 0x10);
            pFVar23[-2].fractionality = *(double *)((long)(pvVar36 + -2) + 0x10);
            pFVar23[-2].row_ep_norm2 = dVar45;
            *(undefined4 *)((long)&pFVar23[-2].row_ep_norm2 + 4) = uVar12;
            *(undefined4 *)&pFVar23[-2].score = uVar13;
            *(undefined4 *)((long)&pFVar23[-2].score + 4) = uVar14;
            pFVar23[-2].basisIndex = HVar15;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(&pFVar23[-2].row_ep,pvVar36);
            *(ulong *)((long)(pvVar36 + -1) + 4) =
                 CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
            *(undefined8 *)((long)(pvVar36 + -1) + 0xc) = local_198._20_8_;
            *(double *)((long)(pvVar36 + -2) + 0x10) = local_198.fractionality;
            *(ulong *)(pvVar36 + -1) =
                 CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
            ppVar28 = (pvVar36->
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            (pvVar36->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = local_d8;
            (pvVar36->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = ppStack_d0;
            (pvVar36->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = local_f8;
            if (ppVar28 != (pointer)0x0) {
              operator_delete(ppVar28);
            }
            pFVar25 = local_148;
            if (0x1c00 < lVar35) {
              local_198.fractionality = ((FractionalInteger *)((long)this + 0x38))->fractionality;
              local_198._20_8_ =
                   *(undefined8 *)((long)&((FractionalInteger *)((long)this + 0x38))->score + 4);
              local_198.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)
                            ((long)&((FractionalInteger *)((long)this + 0x38))->row_ep_norm2 + 4) >>
                   0x20);
              local_198.row_ep_norm2._0_4_ =
                   SUB84(((FractionalInteger *)((long)this + 0x38))->row_ep_norm2,0);
              local_198.row_ep_norm2._4_4_ =
                   (undefined4)
                   ((ulong)((FractionalInteger *)((long)this + 0x38))->row_ep_norm2 >> 0x20);
              ppVar28 = (((FractionalInteger *)((long)this + 0x38))->row_ep).
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)
                       ((long)&local_158->first +
                       (long)&(((FractionalInteger *)((long)this + 0x38))->row_ep).
                              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              local_f8 = (((FractionalInteger *)((long)this + 0x38))->row_ep).
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppStack_f0 = (((FractionalInteger *)((long)this + 0x38))->row_ep).
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              (((FractionalInteger *)((long)this + 0x38))->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (((FractionalInteger *)((long)this + 0x38))->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (((FractionalInteger *)((long)this + 0x38))->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              dVar45 = (double)puVar1[-3];
              uVar12 = *(undefined4 *)((long)puVar1 + -0x14);
              uVar13 = *(undefined4 *)(puVar1 + -2);
              uVar14 = *(undefined4 *)((long)puVar1 + -0xc);
              HVar15 = *(HighsInt *)(puVar1 + -1);
              ((FractionalInteger *)((long)this + 0x38))->fractionality = (double)puVar1[-4];
              ((FractionalInteger *)((long)this + 0x38))->row_ep_norm2 = dVar45;
              *(undefined4 *)((long)&((FractionalInteger *)((long)this + 0x38))->row_ep_norm2 + 4) =
                   uVar12;
              *(undefined4 *)&((FractionalInteger *)((long)this + 0x38))->score = uVar13;
              *(undefined4 *)((long)&((FractionalInteger *)((long)this + 0x38))->score + 4) = uVar14
              ;
              ((FractionalInteger *)((long)this + 0x38))->basisIndex = HVar15;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign(&((FractionalInteger *)((long)this + 0x38))->row_ep,puVar1);
              *(ulong *)((long)puVar1 + -0x14) =
                   CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
              *(undefined8 *)((long)puVar1 + -0xc) = local_198._20_8_;
              puVar1[-4] = local_198.fractionality;
              puVar1[-3] = CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
              pvVar6 = (void *)*puVar1;
              *puVar1 = local_f8;
              puVar1[1] = ppStack_f0;
              puVar1[2] = ppVar28;
              if (pvVar6 != (void *)0x0) {
                operator_delete(pvVar6);
              }
              local_198.fractionality = ((FractionalInteger *)((long)this + 0x70))->fractionality;
              local_198._20_8_ =
                   *(undefined8 *)((long)&((FractionalInteger *)((long)this + 0x70))->score + 4);
              local_198.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)
                            ((long)&((FractionalInteger *)((long)this + 0x70))->row_ep_norm2 + 4) >>
                   0x20);
              local_198.row_ep_norm2._0_4_ =
                   SUB84(((FractionalInteger *)((long)this + 0x70))->row_ep_norm2,0);
              local_198.row_ep_norm2._4_4_ =
                   (undefined4)
                   ((ulong)((FractionalInteger *)((long)this + 0x70))->row_ep_norm2 >> 0x20);
              ppVar28 = (((FractionalInteger *)((long)this + 0x70))->row_ep).
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)
                       ((long)&local_158->first +
                       (long)&(((FractionalInteger *)((long)this + 0x70))->row_ep).
                              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              local_158 = (((FractionalInteger *)((long)this + 0x70))->row_ep).
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              ppStack_150 = (((FractionalInteger *)((long)this + 0x70))->row_ep).
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              (((FractionalInteger *)((long)this + 0x70))->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (((FractionalInteger *)((long)this + 0x70))->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (((FractionalInteger *)((long)this + 0x70))->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              dVar45 = (double)puVar1[-3];
              uVar12 = *(undefined4 *)((long)puVar1 + -0x14);
              uVar13 = *(undefined4 *)(puVar1 + -2);
              uVar14 = *(undefined4 *)((long)puVar1 + -0xc);
              HVar15 = *(HighsInt *)(puVar1 + -1);
              ((FractionalInteger *)((long)this + 0x70))->fractionality = (double)puVar1[-4];
              ((FractionalInteger *)((long)this + 0x70))->row_ep_norm2 = dVar45;
              *(undefined4 *)((long)&((FractionalInteger *)((long)this + 0x70))->row_ep_norm2 + 4) =
                   uVar12;
              *(undefined4 *)&((FractionalInteger *)((long)this + 0x70))->score = uVar13;
              *(undefined4 *)((long)&((FractionalInteger *)((long)this + 0x70))->score + 4) = uVar14
              ;
              ((FractionalInteger *)((long)this + 0x70))->basisIndex = HVar15;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign(&((FractionalInteger *)((long)this + 0x70))->row_ep,puVar1);
              *(ulong *)((long)puVar1 + -0x14) =
                   CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
              *(undefined8 *)((long)puVar1 + -0xc) = local_198._20_8_;
              puVar1[-4] = local_198.fractionality;
              puVar1[-3] = CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
              pvVar6 = (void *)*puVar1;
              *puVar1 = local_158;
              puVar1[1] = ppStack_150;
              puVar1[2] = ppVar28;
              if (pvVar6 != (void *)0x0) {
                operator_delete(pvVar6);
              }
              local_198.fractionality = pFVar23[-3].fractionality;
              local_198._20_8_ = *(undefined8 *)((long)&pFVar23[-3].score + 4);
              local_198.score._0_4_ =
                   (undefined4)((ulong)*(undefined8 *)((long)&pFVar23[-3].row_ep_norm2 + 4) >> 0x20)
              ;
              local_198.row_ep_norm2._0_4_ = SUB84(pFVar23[-3].row_ep_norm2,0);
              local_198.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar23[-3].row_ep_norm2 >> 0x20);
              ppVar28 = pFVar23[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pvVar36 = &pFVar23[~(ulong)local_128 - 1].row_ep;
              local_158 = pFVar23[-3].row_ep.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              ppStack_150 = pFVar23[-3].row_ep.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              pFVar23[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              pFVar23[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              pFVar23[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              dVar45 = *(double *)(pvVar36 + -1);
              uVar12 = *(undefined4 *)((long)(pvVar36 + -1) + 4);
              uVar13 = *(undefined4 *)((long)(pvVar36 + -1) + 8);
              uVar14 = *(undefined4 *)((long)(pvVar36 + -1) + 0xc);
              HVar15 = *(HighsInt *)((long)(pvVar36 + -1) + 0x10);
              pFVar23[-3].fractionality = *(double *)((long)(pvVar36 + -2) + 0x10);
              pFVar23[-3].row_ep_norm2 = dVar45;
              *(undefined4 *)((long)&pFVar23[-3].row_ep_norm2 + 4) = uVar12;
              *(undefined4 *)&pFVar23[-3].score = uVar13;
              *(undefined4 *)((long)&pFVar23[-3].score + 4) = uVar14;
              pFVar23[-3].basisIndex = HVar15;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign(&pFVar23[-3].row_ep,pvVar36);
              *(ulong *)((long)(pvVar36 + -1) + 4) =
                   CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
              *(undefined8 *)((long)(pvVar36 + -1) + 0xc) = local_198._20_8_;
              *(double *)((long)(pvVar36 + -2) + 0x10) = local_198.fractionality;
              *(ulong *)(pvVar36 + -1) =
                   CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
              ppVar5 = (pvVar36->
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              (pvVar36->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = local_158;
              (pvVar36->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = ppStack_150;
              (pvVar36->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
              if (ppVar5 != (pointer)0x0) {
                operator_delete(ppVar5);
              }
              local_198.fractionality = pFVar23[-4].fractionality;
              local_198._20_8_ = *(undefined8 *)((long)&pFVar23[-4].score + 4);
              local_198.score._0_4_ =
                   (undefined4)((ulong)*(undefined8 *)((long)&pFVar23[-4].row_ep_norm2 + 4) >> 0x20)
              ;
              local_198.row_ep_norm2._0_4_ = SUB84(pFVar23[-4].row_ep_norm2,0);
              local_198.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar23[-4].row_ep_norm2 >> 0x20);
              ppVar28 = pFVar23[-4].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pvVar36 = &pFVar23[-3 - (long)local_128].row_ep;
              local_128 = pFVar23[-4].row_ep.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              ppStack_120 = pFVar23[-4].row_ep.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              pFVar23[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              pFVar23[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              pFVar23[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              dVar45 = *(double *)(pvVar36 + -1);
              uVar12 = *(undefined4 *)((long)(pvVar36 + -1) + 4);
              uVar13 = *(undefined4 *)((long)(pvVar36 + -1) + 8);
              uVar14 = *(undefined4 *)((long)(pvVar36 + -1) + 0xc);
              HVar15 = *(HighsInt *)((long)(pvVar36 + -1) + 0x10);
              pFVar23[-4].fractionality = *(double *)((long)(pvVar36 + -2) + 0x10);
              pFVar23[-4].row_ep_norm2 = dVar45;
              *(undefined4 *)((long)&pFVar23[-4].row_ep_norm2 + 4) = uVar12;
              *(undefined4 *)&pFVar23[-4].score = uVar13;
              *(undefined4 *)((long)&pFVar23[-4].score + 4) = uVar14;
              pFVar23[-4].basisIndex = HVar15;
              std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              _M_move_assign(&pFVar23[-4].row_ep,pvVar36);
              *(ulong *)((long)(pvVar36 + -1) + 4) =
                   CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
              *(undefined8 *)((long)(pvVar36 + -1) + 0xc) = local_198._20_8_;
              *(double *)((long)(pvVar36 + -2) + 0x10) = local_198.fractionality;
              *(ulong *)(pvVar36 + -1) =
                   CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
              ppVar5 = (pvVar36->
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              (pvVar36->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = local_128;
              (pvVar36->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = ppStack_120;
              (pvVar36->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
              pFVar25 = local_148;
              if (ppVar5 != (pointer)0x0) {
                operator_delete(ppVar5);
                pFVar25 = local_148;
              }
            }
          }
          if ((long)local_118 < 0x509) goto LAB_002ee630;
          local_148 = (FractionalInteger *)((ulong)pFVar25 >> 2);
          local_128 = (pointer)((long)local_148 * 0x38);
          local_198.fractionality = pFVar23->fractionality;
          local_198._20_8_ = *(undefined8 *)((long)&pFVar23->score + 4);
          local_198.score._0_4_ =
               (undefined4)((ulong)*(undefined8 *)((long)&pFVar23->row_ep_norm2 + 4) >> 0x20);
          local_198.row_ep_norm2._0_4_ = SUB84(pFVar23->row_ep_norm2,0);
          local_198.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar23->row_ep_norm2 >> 0x20);
          ppVar28 = (pFVar23->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pvVar36 = &pFVar23[(long)local_148].row_ep;
          local_158 = (pFVar23->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppStack_150 = (pFVar23->row_ep).
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          (pFVar23->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pFVar23->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pFVar23->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar45 = *(double *)(pvVar36 + -1);
          uVar12 = *(undefined4 *)((long)(pvVar36 + -1) + 4);
          uVar13 = *(undefined4 *)((long)(pvVar36 + -1) + 8);
          uVar14 = *(undefined4 *)((long)(pvVar36 + -1) + 0xc);
          HVar15 = *(HighsInt *)((long)(pvVar36 + -1) + 0x10);
          pFVar23->fractionality = *(double *)((long)(pvVar36 + -2) + 0x10);
          pFVar23->row_ep_norm2 = dVar45;
          *(undefined4 *)((long)&pFVar23->row_ep_norm2 + 4) = uVar12;
          *(undefined4 *)&pFVar23->score = uVar13;
          *(undefined4 *)((long)&pFVar23->score + 4) = uVar14;
          pFVar23->basisIndex = HVar15;
          std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          _M_move_assign(&pFVar23->row_ep,pvVar36);
          *(ulong *)((long)(pvVar36 + -1) + 4) =
               CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
          *(undefined8 *)((long)(pvVar36 + -1) + 0xc) = local_198._20_8_;
          *(double *)((long)(pvVar36 + -2) + 0x10) = local_198.fractionality;
          *(ulong *)(pvVar36 + -1) =
               CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
          ppVar5 = (pvVar36->
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          (pvVar36->
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
          _M_impl.super__Vector_impl_data._M_start = local_158;
          (pvVar36->
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = ppStack_150;
          (pvVar36->
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
          if (ppVar5 != (pointer)0x0) {
            operator_delete(ppVar5);
          }
          local_198.fractionality = (local_e0._M_current)->fractionality;
          local_198._20_8_ = *(undefined8 *)((long)&(local_e0._M_current)->score + 4);
          local_198.score._0_4_ =
               (undefined4)
               ((ulong)*(undefined8 *)((long)&(local_e0._M_current)->row_ep_norm2 + 4) >> 0x20);
          local_198.row_ep_norm2._0_4_ = SUB84((local_e0._M_current)->row_ep_norm2,0);
          local_198.row_ep_norm2._4_4_ =
               (undefined4)((ulong)(local_e0._M_current)->row_ep_norm2 >> 0x20);
          ppVar28 = begin._M_current[-1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pvVar36 = &begin._M_current[-(long)local_148].row_ep;
          local_158 = begin._M_current[-1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppStack_150 = begin._M_current[-1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          (local_b0->
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (local_b0->
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_b0->
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar45 = *(double *)((long)(pvVar36 + -2) + 0x10);
          dVar3 = *(double *)(pvVar36 + -1);
          uVar12 = *(undefined4 *)((long)(pvVar36 + -1) + 8);
          uVar13 = *(undefined4 *)((long)(pvVar36 + -1) + 0xc);
          HVar15 = *(HighsInt *)((long)(pvVar36 + -1) + 0x10);
          *(undefined4 *)((long)&(local_e0._M_current)->row_ep_norm2 + 4) =
               *(undefined4 *)((long)(pvVar36 + -1) + 4);
          *(undefined4 *)&(local_e0._M_current)->score = uVar12;
          *(undefined4 *)((long)&(local_e0._M_current)->score + 4) = uVar13;
          (local_e0._M_current)->basisIndex = HVar15;
          (local_e0._M_current)->fractionality = dVar45;
          (local_e0._M_current)->row_ep_norm2 = dVar3;
          std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          _M_move_assign(local_b0,pvVar36);
          *(ulong *)((long)(pvVar36 + -1) + 4) =
               CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
          *(undefined8 *)((long)(pvVar36 + -1) + 0xc) = local_198._20_8_;
          *(double *)((long)(pvVar36 + -2) + 0x10) = local_198.fractionality;
          *(ulong *)(pvVar36 + -1) =
               CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
          ppVar5 = (pvVar36->
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          (pvVar36->
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
          _M_impl.super__Vector_impl_data._M_start = local_158;
          (pvVar36->
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = ppStack_150;
          (pvVar36->
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
          if (ppVar5 != (pointer)0x0) {
            operator_delete(ppVar5);
          }
          if (0x1c00 < (long)local_118) {
            local_198.fractionality = pFVar23[1].fractionality;
            local_198._20_8_ = *(undefined8 *)((long)&pFVar23[1].score + 4);
            local_198.score._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)&pFVar23[1].row_ep_norm2 + 4) >> 0x20);
            local_198.row_ep_norm2._0_4_ = SUB84(pFVar23[1].row_ep_norm2,0);
            local_198.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar23[1].row_ep_norm2 >> 0x20);
            ppVar28 = pFVar23[1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar1 = (undefined8 *)
                     ((long)&local_128->first +
                     (long)&pFVar23[1].row_ep.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
            local_118 = pFVar23[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppStack_110 = pFVar23[1].row_ep.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            pFVar23[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            pFVar23[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            pFVar23[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            dVar45 = (double)puVar1[-3];
            uVar12 = *(undefined4 *)((long)puVar1 + -0x14);
            uVar13 = *(undefined4 *)(puVar1 + -2);
            uVar14 = *(undefined4 *)((long)puVar1 + -0xc);
            HVar15 = *(HighsInt *)(puVar1 + -1);
            pFVar23[1].fractionality = (double)puVar1[-4];
            pFVar23[1].row_ep_norm2 = dVar45;
            *(undefined4 *)((long)&pFVar23[1].row_ep_norm2 + 4) = uVar12;
            *(undefined4 *)&pFVar23[1].score = uVar13;
            *(undefined4 *)((long)&pFVar23[1].score + 4) = uVar14;
            pFVar23[1].basisIndex = HVar15;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(&pFVar23[1].row_ep,puVar1);
            *(ulong *)((long)puVar1 + -0x14) =
                 CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
            *(undefined8 *)((long)puVar1 + -0xc) = local_198._20_8_;
            puVar1[-4] = local_198.fractionality;
            puVar1[-3] = CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
            pvVar6 = (void *)*puVar1;
            *puVar1 = local_118;
            puVar1[1] = ppStack_110;
            puVar1[2] = ppVar28;
            if (pvVar6 != (void *)0x0) {
              operator_delete(pvVar6);
            }
            local_198.fractionality = pFVar23[2].fractionality;
            local_198._20_8_ = *(undefined8 *)((long)&pFVar23[2].score + 4);
            local_198.score._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)&pFVar23[2].row_ep_norm2 + 4) >> 0x20);
            local_198.row_ep_norm2._0_4_ = SUB84(pFVar23[2].row_ep_norm2,0);
            local_198.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar23[2].row_ep_norm2 >> 0x20);
            ppVar28 = pFVar23[2].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar1 = (undefined8 *)
                     ((long)&local_128->first +
                     (long)&pFVar23[2].row_ep.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
            local_118 = pFVar23[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppStack_110 = pFVar23[2].row_ep.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            pFVar23[2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            pFVar23[2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            pFVar23[2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            dVar45 = (double)puVar1[-3];
            uVar12 = *(undefined4 *)((long)puVar1 + -0x14);
            uVar13 = *(undefined4 *)(puVar1 + -2);
            uVar14 = *(undefined4 *)((long)puVar1 + -0xc);
            HVar15 = *(HighsInt *)(puVar1 + -1);
            pFVar23[2].fractionality = (double)puVar1[-4];
            pFVar23[2].row_ep_norm2 = dVar45;
            *(undefined4 *)((long)&pFVar23[2].row_ep_norm2 + 4) = uVar12;
            *(undefined4 *)&pFVar23[2].score = uVar13;
            *(undefined4 *)((long)&pFVar23[2].score + 4) = uVar14;
            pFVar23[2].basisIndex = HVar15;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(&pFVar23[2].row_ep,puVar1);
            *(ulong *)((long)puVar1 + -0x14) =
                 CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
            *(undefined8 *)((long)puVar1 + -0xc) = local_198._20_8_;
            puVar1[-4] = local_198.fractionality;
            puVar1[-3] = CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
            pvVar6 = (void *)*puVar1;
            *puVar1 = local_118;
            puVar1[1] = ppStack_110;
            puVar1[2] = ppVar28;
            if (pvVar6 != (void *)0x0) {
              operator_delete(pvVar6);
            }
            local_198.fractionality = (local_a0._M_current)->fractionality;
            local_198._20_8_ = *(undefined8 *)((long)&(local_a0._M_current)->score + 4);
            local_198.score._0_4_ =
                 (undefined4)
                 ((ulong)*(undefined8 *)((long)&(local_a0._M_current)->row_ep_norm2 + 4) >> 0x20);
            local_198.row_ep_norm2._0_4_ = SUB84((local_a0._M_current)->row_ep_norm2,0);
            local_198.row_ep_norm2._4_4_ =
                 (undefined4)((ulong)(local_a0._M_current)->row_ep_norm2 >> 0x20);
            ppVar28 = begin._M_current[-2].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar36 = &begin._M_current[~(ulong)local_148].row_ep;
            local_118 = begin._M_current[-2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppStack_110 = begin._M_current[-2].row_ep.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            (local_58->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (local_58->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (local_58->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            dVar45 = *(double *)((long)(pvVar36 + -2) + 0x10);
            dVar3 = *(double *)(pvVar36 + -1);
            uVar12 = *(undefined4 *)((long)(pvVar36 + -1) + 8);
            uVar13 = *(undefined4 *)((long)(pvVar36 + -1) + 0xc);
            HVar15 = *(HighsInt *)((long)(pvVar36 + -1) + 0x10);
            *(undefined4 *)((long)&(local_a0._M_current)->row_ep_norm2 + 4) =
                 *(undefined4 *)((long)(pvVar36 + -1) + 4);
            *(undefined4 *)&(local_a0._M_current)->score = uVar12;
            *(undefined4 *)((long)&(local_a0._M_current)->score + 4) = uVar13;
            (local_a0._M_current)->basisIndex = HVar15;
            (local_a0._M_current)->fractionality = dVar45;
            (local_a0._M_current)->row_ep_norm2 = dVar3;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(local_58,pvVar36);
            *(ulong *)((long)(pvVar36 + -1) + 4) =
                 CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
            *(undefined8 *)((long)(pvVar36 + -1) + 0xc) = local_198._20_8_;
            *(double *)((long)(pvVar36 + -2) + 0x10) = local_198.fractionality;
            *(ulong *)(pvVar36 + -1) =
                 CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
            ppVar5 = (pvVar36->
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            (pvVar36->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = local_118;
            (pvVar36->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = ppStack_110;
            (pvVar36->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
            if (ppVar5 != (pointer)0x0) {
              operator_delete(ppVar5);
            }
            local_198.fractionality = (local_a8._M_current)->fractionality;
            local_198._20_8_ = *(undefined8 *)((long)&(local_a8._M_current)->score + 4);
            local_198.score._0_4_ =
                 (undefined4)
                 ((ulong)*(undefined8 *)((long)&(local_a8._M_current)->row_ep_norm2 + 4) >> 0x20);
            local_198.row_ep_norm2._0_4_ = SUB84((local_a8._M_current)->row_ep_norm2,0);
            local_198.row_ep_norm2._4_4_ =
                 (undefined4)((ulong)(local_a8._M_current)->row_ep_norm2 >> 0x20);
            ppVar28 = begin._M_current[-3].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar36 = &begin._M_current[-2 - (long)local_148].row_ep;
            local_148 = (FractionalInteger *)
                        begin._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppStack_140 = begin._M_current[-3].row_ep.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            (local_60->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (local_60->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (local_60->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            dVar45 = *(double *)((long)(pvVar36 + -2) + 0x10);
            dVar3 = *(double *)(pvVar36 + -1);
            uVar12 = *(undefined4 *)((long)(pvVar36 + -1) + 8);
            uVar13 = *(undefined4 *)((long)(pvVar36 + -1) + 0xc);
            HVar15 = *(HighsInt *)((long)(pvVar36 + -1) + 0x10);
            *(undefined4 *)((long)&(local_a8._M_current)->row_ep_norm2 + 4) =
                 *(undefined4 *)((long)(pvVar36 + -1) + 4);
            *(undefined4 *)&(local_a8._M_current)->score = uVar12;
            *(undefined4 *)((long)&(local_a8._M_current)->score + 4) = uVar13;
            (local_a8._M_current)->basisIndex = HVar15;
            (local_a8._M_current)->fractionality = dVar45;
            (local_a8._M_current)->row_ep_norm2 = dVar3;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(local_60,pvVar36);
            *(ulong *)((long)(pvVar36 + -1) + 4) =
                 CONCAT44(local_198.score._0_4_,local_198.row_ep_norm2._4_4_);
            *(undefined8 *)((long)(pvVar36 + -1) + 0xc) = local_198._20_8_;
            *(double *)((long)(pvVar36 + -2) + 0x10) = local_198.fractionality;
            *(ulong *)(pvVar36 + -1) =
                 CONCAT44(local_198.row_ep_norm2._4_4_,local_198.row_ep_norm2._0_4_);
            ppVar5 = (pvVar36->
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            (pvVar36->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_148;
            (pvVar36->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = ppStack_140;
            (pvVar36->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar28;
            if (ppVar5 != (pointer)0x0) {
              operator_delete(ppVar5);
            }
          }
          end._M_current = (FractionalInteger *)CONCAT71(uStack_1c7,leftmost_00);
        }
        else if (local_90 < local_98) {
LAB_002ee630:
          end._M_current = (FractionalInteger *)CONCAT71(uStack_1c7,leftmost_00);
        }
        else {
          end._M_current._1_7_ = uStack_1c7;
          end._M_current._0_1_ = leftmost_00;
          comp_00.this = pHVar33;
          bVar18 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                             (this,_Var29,end,comp_00);
          if (bVar18) {
            comp_01.this = pHVar33;
            comp_01.edgeWt = (double **)comp_00.edgeWt;
            bVar19 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                               ((pdqsort_detail *)pFVar23,begin,end,comp_01);
            bVar18 = true;
            if (bVar19) goto LAB_002eeb0b;
          }
        }
        comp_02.this._0_4_ = local_fc;
        comp_02.edgeWt = (double **)comp_00.edgeWt;
        comp_02.this._4_4_ = 0;
        pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0,false>
                  (this,_Var29,end,comp_02,local_12c & 1,(bool)leftmost_00);
        bVar18 = false;
        local_12c = 0;
        this = (pdqsort_detail *)pFVar23;
      }
    }
LAB_002eeb0b:
    if (bVar18) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }